

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variable.cpp
# Opt level: O0

void __thiscall ninx::lexer::token::Variable::Variable(Variable *this,int line_number,string *name)

{
  string *name_local;
  int line_number_local;
  Variable *this_local;
  
  Token::Token(&this->super_Token,line_number);
  (this->super_Token)._vptr_Token = (_func_int **)&PTR__Variable_00288788;
  std::__cxx11::string::string((string *)&this->name,(string *)name);
  this->trailing_spaces = 0;
  return;
}

Assistant:

ninx::lexer::token::Variable::Variable(int line_number, const std::string &name) : Token(line_number), name(name) {}